

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::anon_unknown_5::MaximumMatcher::FindArgumentPathDFS
          (MaximumMatcher *this,int v,vector<bool,_std::allocator<bool>_> *visited)

{
  ulong *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  iVar3 = v + 0x3f;
  if (-1 < v) {
    iVar3 = v;
  }
  puVar1 = (visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           (long)(iVar3 >> 6) +
           (ulong)(((long)v & 0x800000000000003fU) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)v & 0x3f);
  iVar3 = this->count2_;
  if (0 < iVar3) {
    lVar6 = 0;
    do {
      if ((this->match_list2_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar6] == -1) {
        bVar2 = Match(this,v,(int)lVar6);
        if (bVar2) goto LAB_00317894;
        iVar3 = this->count2_;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
    if (0 < iVar3) {
      lVar6 = 0;
      do {
        iVar3 = (this->match_list2_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        uVar5 = (ulong)iVar3;
        if ((uVar5 != 0xffffffffffffffff) && (bVar2 = Match(this,v,(int)lVar6), bVar2)) {
          iVar4 = iVar3 + 0x3f;
          if (-1 < iVar3) {
            iVar4 = iVar3;
          }
          if ((((visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [(long)(iVar4 >> 6) +
                 (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
                (uVar5 & 0x3f) & 1) == 0) &&
             (bVar2 = FindArgumentPathDFS(this,iVar3,visited), bVar2)) {
LAB_00317894:
            (this->match_list2_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar6] = v;
            return true;
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->count2_);
    }
  }
  return false;
}

Assistant:

bool MaximumMatcher::FindArgumentPathDFS(int v, std::vector<bool>* visited) {
  (*visited)[v] = true;
  // We try to match those un-matched nodes on the right side first. This is
  // the step that the naive greedy matching algorithm uses. In the best cases
  // where the greedy algorithm can find a maximum matching, we will always
  // find a match in this step and the performance will be identical to the
  // greedy algorithm.
  for (int i = 0; i < count2_; ++i) {
    int matched = (*match_list2_)[i];
    if (matched == -1 && Match(v, i)) {
      (*match_list2_)[i] = v;
      return true;
    }
  }
  // Then we try those already matched nodes and see if we can find an
  // alternative match for the node matched to them.
  // The greedy algorithm will stop before this and fail to produce the
  // correct result.
  for (int i = 0; i < count2_; ++i) {
    int matched = (*match_list2_)[i];
    if (matched != -1 && Match(v, i)) {
      if (!(*visited)[matched] && FindArgumentPathDFS(matched, visited)) {
        (*match_list2_)[i] = v;
        return true;
      }
    }
  }
  return false;
}